

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

void __thiscall libtorrent::append_path(libtorrent *this,string *branch,string_view leaf)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  const_pointer pvVar4;
  bool need_sep;
  string *branch_local;
  string_view leaf_local;
  
  leaf_local._M_len = leaf._M_len;
  branch_local = branch;
  uVar2 = ::std::__cxx11::string::empty();
  if (((uVar2 & 1) != 0) ||
     (bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )this,"."), bVar1)) {
    pvVar4 = ::std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&branch_local);
    ::std::basic_string_view<char,_std::char_traits<char>_>::size
              ((basic_string_view<char,_std::char_traits<char>_> *)&branch_local);
    ::std::__cxx11::string::assign((char *)this,(ulong)pvVar4);
  }
  else {
    bVar1 = ::std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&branch_local);
    if (!bVar1) {
      ::std::__cxx11::string::size();
      pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)this);
      if (*pcVar3 != '/') {
        ::std::__cxx11::string::operator+=((string *)this,'/');
      }
      pvVar4 = ::std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)&branch_local);
      ::std::basic_string_view<char,_std::char_traits<char>_>::size
                ((basic_string_view<char,_std::char_traits<char>_> *)&branch_local);
      ::std::__cxx11::string::append((char *)this,(ulong)pvVar4);
    }
  }
  return;
}

Assistant:

void append_path(std::string& branch, string_view leaf)
	{
		TORRENT_ASSERT(!is_complete(leaf));
		if (branch.empty() || branch == ".")
		{
			branch.assign(leaf.data(), leaf.size());
			return;
		}
		if (leaf.empty()) return;

#if defined(TORRENT_WINDOWS) || defined(TORRENT_OS2)
#define TORRENT_SEPARATOR_CHAR '\\'
		bool const need_sep = branch[branch.size()-1] != '\\'
			&& branch[branch.size()-1] != '/';
#else
#define TORRENT_SEPARATOR_CHAR '/'
		bool const need_sep = branch[branch.size()-1] != '/';
#endif

		if (need_sep) branch += TORRENT_SEPARATOR_CHAR;
		branch.append(leaf.data(), leaf.size());
	}